

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_756638::CodemodelConfig::CodemodelConfig
          (CodemodelConfig *this,cmFileAPI *fileAPI,unsigned_long version,string *config)

{
  cmake *pcVar1;
  string *psVar2;
  string *config_local;
  unsigned_long version_local;
  cmFileAPI *fileAPI_local;
  CodemodelConfig *this_local;
  
  this->FileAPI = fileAPI;
  this->Version = version;
  this->Config = config;
  pcVar1 = cmFileAPI::GetCMakeInstance(this->FileAPI);
  psVar2 = cmake::GetHomeDirectory_abi_cxx11_(pcVar1);
  std::__cxx11::string::string((string *)&this->TopSource,(string *)psVar2);
  pcVar1 = cmFileAPI::GetCMakeInstance(this->FileAPI);
  psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar1);
  std::__cxx11::string::string((string *)&this->TopBuild,(string *)psVar2);
  std::
  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
  ::map(&this->DirectoryMap);
  std::
  vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  ::vector(&this->Directories);
  std::
  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
  ::map(&this->ProjectMap);
  std::
  vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
  ::vector(&this->Projects);
  return;
}

Assistant:

CodemodelConfig::CodemodelConfig(cmFileAPI& fileAPI, unsigned long version,
                                 std::string const& config)
  : FileAPI(fileAPI)
  , Version(version)
  , Config(config)
  , TopSource(this->FileAPI.GetCMakeInstance()->GetHomeDirectory())
  , TopBuild(this->FileAPI.GetCMakeInstance()->GetHomeOutputDirectory())
{
  static_cast<void>(this->Version);
}